

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O1

int IDAGetQuadNumRhsEvals(void *ida_mem,long *nrQevals)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar1 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x68d;
  }
  else {
    if (*(int *)((long)ida_mem + 0x60) != 0) {
      *nrQevals = *(long *)((long)ida_mem + 0x5c8);
      return 0;
    }
    msgfmt = "Illegal attempt to call before calling IDAQuadInit.";
    iVar1 = -0x1e;
    error_code = -0x1e;
    line = 0x695;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDAGetQuadNumRhsEvals",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int IDAGetQuadNumRhsEvals(void* ida_mem, long int* nrQevals)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_quadr == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUAD, __LINE__, __func__, __FILE__,
                    MSG_NO_QUAD);
    return (IDA_NO_QUAD);
  }

  *nrQevals = IDA_mem->ida_nrQe;

  return (IDA_SUCCESS);
}